

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Reg2Aux
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,uint byteOffset,int C1)

{
  code *pcVar1;
  RegSlot RVar2;
  bool bVar3;
  RegSlot RVar4;
  RegSlot RVar5;
  uint uVar6;
  undefined4 *puVar7;
  RegSlot local_34;
  RegSlot local_30;
  OpLayoutReg2Aux data;
  int C1_local;
  uint byteOffset_local;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  data.super_OpLayoutAuxiliary.R0 = C1;
  data.R1 = byteOffset;
  CheckOpen(this);
  RVar4 = ConsumeReg(this,R0);
  RVar5 = ConsumeReg(this,R1);
  RVar2 = data.R1;
  uVar6 = Data::GetCurrentOffset(&this->m_auxiliaryData);
  if (uVar6 <= RVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xa30,"(byteOffset < m_auxiliaryData.GetCurrentOffset())",
                                "byteOffset < m_auxiliaryData.GetCurrentOffset()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  local_34 = data.R1;
  local_30 = data.super_OpLayoutAuxiliary.R0;
  data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.Offset = RVar4;
  data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.C1 = RVar5;
  Data::Encode(&this->m_byteCodeData,op,&local_34,0x10,this);
  return;
}

Assistant:

void ByteCodeWriter::Reg2Aux(OpCode op, RegSlot R0, RegSlot R1, uint byteOffset, int C1)
    {
        CheckOpen();
        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        //
        // Write the buffer's contents
        //

        Assert(byteOffset < m_auxiliaryData.GetCurrentOffset());

        OpLayoutReg2Aux data;
        data.R0 = R0;
        data.R1 = R1;
        data.Offset = byteOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }